

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_compare_quiet_mips(float128 a,float128 b,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = a.high;
  uVar6 = a.low;
  uVar2 = b.high;
  uVar3 = b.low;
  uVar7 = 0xffffffffffff;
  if ((((~uVar5 & 0x7fff000000000000) != 0) ||
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar6 == 0)) &&
     (((~uVar2 & 0x7fff000000000000) != 0 ||
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
       uVar3 == 0)))) {
    if (uVar5 >> 0x3f == uVar2 >> 0x3f) {
      if (uVar5 == uVar2 && uVar6 == uVar3) {
        return 0;
      }
      uVar1 = (uint)(byte)(((uVar6 < uVar3 && uVar5 == uVar2 || uVar5 < uVar2) ^ a.high._7_1_ >> 7)
                          * '\x02');
    }
    else {
      if ((((uVar2 | uVar5) & 0x7fffffffffffffff) == 0 && uVar6 == 0) && uVar3 == 0) {
        return 0;
      }
      uVar1 = (a.high._4_4_ >> 0x1f) * -2 & 0xff;
    }
    return 1 - uVar1;
  }
  if (status->snan_bit_is_one == '\0') {
    if ((uVar5 & 0x7fff800000000000) == 0x7fff000000000000) {
      uVar4 = 0x7fffffffffff;
      goto LAB_00726144;
    }
  }
  else {
    uVar4 = 0xffffffffffff;
    if (0xfffeffffffffffff < uVar5 * 2) {
LAB_00726144:
      if ((uVar4 & uVar5) != 0 || uVar6 != 0) goto LAB_00726189;
    }
  }
  if (status->snan_bit_is_one == '\0') {
    if ((uVar2 & 0x7fff800000000000) != 0x7fff000000000000) {
      return 2;
    }
    uVar7 = 0x7fffffffffff;
  }
  else if (uVar2 * 2 < 0xffff000000000000) {
    return 2;
  }
  if (uVar3 == 0 && (uVar7 & uVar2) == 0) {
    return 2;
  }
LAB_00726189:
  status->float_exception_flags = status->float_exception_flags | 1;
  return 2;
}

Assistant:

int float128_compare_quiet(float128 a, float128 b, float_status *status)
{
    return float128_compare_internal(a, b, 1, status);
}